

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::loadClusive
          (AbstractNumericFacetValidator *this,XSerializeEngine *serEng,bool *inherited,
          XMLNumber **data,NumberType numType,int flag)

{
  XMLNumber *pXVar1;
  AbstractNumericFacetValidator *this_00;
  AbstractNumericFacetValidator *basedv;
  int flag_local;
  NumberType numType_local;
  XMLNumber **data_local;
  bool *inherited_local;
  XSerializeEngine *serEng_local;
  AbstractNumericFacetValidator *this_local;
  
  XSerializeEngine::operator>>(serEng,inherited);
  if ((*inherited & 1U) == 0) {
    pXVar1 = XMLNumber::loadNumber(numType,serEng);
    *data = pXVar1;
  }
  else {
    this_00 = (AbstractNumericFacetValidator *)
              DatatypeValidator::getBaseValidator(&this->super_DatatypeValidator);
    switch(flag) {
    case 1:
      pXVar1 = getMaxInclusive(this_00);
      *data = pXVar1;
      break;
    case 2:
      pXVar1 = getMaxExclusive(this_00);
      *data = pXVar1;
      break;
    case 3:
      pXVar1 = getMinInclusive(this_00);
      *data = pXVar1;
      break;
    case 4:
      pXVar1 = getMinExclusive(this_00);
      *data = pXVar1;
    }
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::loadClusive(XSerializeEngine&       serEng
                                              , bool&                   inherited
                                              , XMLNumber*&             data
                                              , XMLNumber::NumberType   numType
                                              , int                     flag)
{
    serEng>>inherited;

    if (!inherited)
        data = XMLNumber::loadNumber(numType, serEng);
    else
    {
        AbstractNumericFacetValidator* basedv = (AbstractNumericFacetValidator*) getBaseValidator();

        switch(flag)
        {
        case 1: 
            data = basedv->getMaxInclusive();
            break;
        case 2:
            data = basedv->getMaxExclusive();
            break;
        case 3:
            data = basedv->getMinInclusive();
            break;
        case 4:
            data = basedv->getMinExclusive();
            break;
        default:
            break;
        }

    }

}